

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O3

void GetFiles(string *pattern,
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *files)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  glob_t g;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  LogMessage local_88;
  glob_t local_78;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(files,(files->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
  iVar1 = glob((pattern->_M_dataplus)._M_p,0,(__errfunc *)0x0,&local_78);
  if ((iVar1 != 0) && (iVar1 != 3)) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x272);
    poVar2 = google::LogMessage::stream(&local_88);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Check failed: (r == 0) || (r == GLOB_NOMATCH) ",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": error matching ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(pattern->_M_dataplus)._M_p,pattern->_M_string_length);
    if (iVar1 != 3) {
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_88);
    }
  }
  if (local_78.gl_pathc != 0) {
    uVar3 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,local_78.gl_pathv[uVar3],&local_a9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,
                 &local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < local_78.gl_pathc);
  }
  globfree(&local_78);
  return;
}

Assistant:

static void GetFiles(const string& pattern, vector<string>* files) {
  files->clear();
#if defined(HAVE_GLOB_H)
  glob_t g;
  const int r = glob(pattern.c_str(), 0, NULL, &g);
  CHECK((r == 0) || (r == GLOB_NOMATCH)) << ": error matching " << pattern;
  for (size_t i = 0; i < g.gl_pathc; i++) {
    files->push_back(string(g.gl_pathv[i]));
  }
  globfree(&g);
#elif defined(OS_WINDOWS)
  WIN32_FIND_DATAA data;
  HANDLE handle = FindFirstFileA(pattern.c_str(), &data);
  size_t index = pattern.rfind('\\');
  if (index == string::npos) {
    LOG(FATAL) << "No directory separator.";
  }
  const string dirname = pattern.substr(0, index + 1);
  if (handle == INVALID_HANDLE_VALUE) {
    // Finding no files is OK.
    return;
  }
  do {
    files->push_back(dirname + data.cFileName);
  } while (FindNextFileA(handle, &data));
  BOOL result = FindClose(handle);
  LOG_SYSRESULT(result);
#else
# error There is no way to do glob.
#endif
}